

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> * __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
query_name_abi_cxx11_
          (local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this)

{
  ostream *poVar1;
  long in_RSI;
  ostringstream local_190 [8];
  ostringstream s;
  local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"<mbox:type=MPMC:id=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulonglong *)(in_RSI + 0x10));
  std::operator<<(poVar1,">");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

virtual std::string
		query_name() const override
			{
				std::ostringstream s;
				s << "<mbox:type=MPMC:id=" << m_id << ">";

				return s.str();
			}